

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void c4::handle_warning(srcloc where,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_4d8 [24];
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  char buf [1024];
  
  args[0].reg_save_area = local_4d8;
  if (in_AL != '\0') {
    local_4a8 = in_XMM0_Qa;
    local_498 = in_XMM1_Qa;
    local_488 = in_XMM2_Qa;
    local_478 = in_XMM3_Qa;
    local_468 = in_XMM4_Qa;
    local_458 = in_XMM5_Qa;
    local_448 = in_XMM6_Qa;
    local_438 = in_XMM7_Qa;
  }
  args[0].gp_offset = 0x18;
  args[0].fp_offset = 0x30;
  args[0].overflow_arg_area = &stack0x00000008;
  local_4c0 = in_RCX;
  local_4b8 = in_R8;
  local_4b0 = in_R9;
  vsnprintf(buf,0x400,fmt,args);
  fputc(10,_stderr);
  fflush(_stderr);
  fprintf(_stderr,"%s:%d: WARNING: %s\n");
  fflush(_stderr);
  return;
}

Assistant:

void handle_warning(srcloc where, const char *fmt, ...)
{
    va_list args;
    char buf[1024]; //sstream<c4::string> ss;
    va_start(args, fmt);
    vsnprintf(buf, sizeof(buf), fmt, args);
    va_end(args);
    C4_LOGF_WARN("\n");
#if defined(C4_ERROR_SHOWS_FILELINE) && defined(C4_ERROR_SHOWS_FUNC)
    C4_LOGF_WARN("%s:%d: WARNING: %s\n", where.file, where.line, buf/*ss.c_strp()*/);
    C4_LOGF_WARN("%s:%d: WARNING: here: %s\n", where.file, where.line, where.func);
#elif defined(C4_ERROR_SHOWS_FILELINE)
    C4_LOGF_WARN("%s:%d: WARNING: %s\n", where.file, where.line, buf/*ss.c_strp()*/);
#elif ! defined(C4_ERROR_SHOWS_FUNC)
    C4_LOGF_WARN("WARNING: %s\n", buf/*ss.c_strp()*/);
#endif
    //c4::log.flush();
}